

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

string * __thiscall
pbrt::ParameterDictionary::ToParameterDefinition
          (string *__return_storage_ptr__,ParameterDictionary *this,string *name)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  pointer __s2;
  ParsedParameter *__n;
  ParameterDictionary *this_00;
  int iVar3;
  int in_ECX;
  long lVar4;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar5 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar5 = paVar1;
  }
  if (sVar2 != 0) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = (ParsedParameter *)name->_M_string_length;
    lVar4 = 0;
    do {
      this_00 = *(ParameterDictionary **)((long)paVar5 + lVar4);
      if (((this_00->params).field_2.fixed[3] == __n) &&
         ((__n == (ParsedParameter *)0x0 ||
          (iVar3 = bcmp((this_00->params).field_2.fixed[2],__s2,(size_t)__n), iVar3 == 0)))) {
        ToParameterDefinition_abi_cxx11_
                  (__return_storage_ptr__,this_00,(ParsedParameter *)0x0,in_ECX);
        return __return_storage_ptr__;
      }
      lVar4 = lVar4 + 8;
    } while (sVar2 << 3 != lVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::ToParameterDefinition(const std::string &name) const {
    for (const ParsedParameter *p : params)
        if (p->name == name)
            return ToParameterDefinition(p, 0);
    return "";
}